

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O0

Output * __thiscall Clasp::Cli::ClaspAppBase::createOutput(ClaspAppBase *this,ProblemType f)

{
  bool bVar1;
  uint uVar2;
  Output *pOVar3;
  byte *pbVar4;
  ClaspFacade *pCVar5;
  int in_ESI;
  Application *in_RDI;
  TextOutput *textOut;
  TextOptions options;
  SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject> out;
  ClaspFacade *in_stack_ffffffffffffff20;
  Output *in_stack_ffffffffffffff28;
  SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject> *in_stack_ffffffffffffff30;
  long local_88;
  uchar local_5b [3];
  long local_58;
  undefined4 local_40;
  uint local_3c;
  undefined8 local_38;
  undefined1 local_30;
  undefined4 local_24;
  SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject> local_20;
  int local_14;
  Output *local_8;
  
  local_14 = in_ESI;
  SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject>::SingleOwnerPtr(&local_20);
  if ((int)in_RDI[0xc].blocked_ == 3) {
    local_8 = (Output *)0x0;
  }
  else {
    if (((int)in_RDI[0xc].blocked_ == 2) && (*(char *)((long)&in_RDI[0xd].exitCode_ + 1) == '\0')) {
      uVar2 = Potassco::Application::verbose(in_RDI);
      (*in_RDI->_vptr_Application[0x1a])(in_RDI,(ulong)uVar2);
      SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject>::reset
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    else {
      local_40 = 0;
      if (local_14 == 0) {
        local_40 = 2;
      }
      else if (local_14 == 1) {
        local_40 = 3;
      }
      else if ((local_14 == 2) && ((int)in_RDI[0xc].blocked_ == 1)) {
        local_40 = 1;
      }
      local_3c = Potassco::Application::verbose(in_RDI);
      local_38 = std::__cxx11::string::c_str();
      local_30 = *(undefined1 *)((long)&in_RDI[0xd]._vptr_Application + 4);
      (*in_RDI->_vptr_Application[0x19])(in_RDI,&local_40);
      SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject>::reset
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      pOVar3 = SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject>::get
                         ((SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject> *)0x118704);
      if (pOVar3 == (Output *)0x0) {
        local_88 = 0;
      }
      else {
        local_88 = __dynamic_cast(pOVar3,&Output::typeinfo,&TextOutput::typeinfo,0);
      }
      local_58 = local_88;
      bVar1 = ParserOptions::isEnabled((ParserOptions *)(in_RDI + 6),parse_maxsat);
      if (((bVar1) && (local_14 == 0)) && (local_58 != 0)) {
        *(char **)(local_58 + 0x40) = "UNKNOWN";
      }
    }
    pOVar3 = SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject>::get
                       ((SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject> *)0x11881d);
    if (pOVar3 != (Output *)0x0) {
      if (*(char *)((long)&in_RDI[0xd]._vptr_Application + 6) != -1) {
        pOVar3 = SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject>::operator->
                           ((SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject> *)0x118856);
        local_5b[2] = 2;
        pbVar4 = std::min<unsigned_char>
                           (local_5b + 2,(uchar *)((long)&in_RDI[0xd]._vptr_Application + 6));
        Output::setModelQuiet(pOVar3,(uint)*pbVar4);
      }
      if (*(char *)((long)&in_RDI[0xd]._vptr_Application + 7) != -1) {
        pOVar3 = SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject>::operator->
                           ((SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject> *)0x1188c1);
        local_5b[1] = 2;
        pbVar4 = std::min<unsigned_char>
                           (local_5b + 1,(uchar *)((long)&in_RDI[0xd]._vptr_Application + 7));
        Output::setOptQuiet(pOVar3,(uint)*pbVar4);
      }
      if ((char)in_RDI[0xd].exitCode_ != -1) {
        pOVar3 = SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject>::operator->
                           ((SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject> *)0x11892c);
        local_5b[0] = '\x02';
        pbVar4 = std::min<unsigned_char>(local_5b,(uchar *)&in_RDI[0xd].exitCode_);
        Output::setCallQuiet(pOVar3,(uint)*pbVar4);
      }
    }
    if ((((ulong)in_RDI[0xd]._vptr_Application & 0x10000000000) != 0) &&
       (pCVar5 = SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject>::get
                           ((SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject> *)0x11899b),
       pCVar5 != (ClaspFacade *)0x0)) {
      in_stack_ffffffffffffff20 =
           SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject>::operator->
                     ((SingleOwnerPtr<Clasp::ClaspFacade,_Clasp::DeleteObject> *)0x1189c1);
      OutputTable::setFilter(&(in_stack_ffffffffffffff20->ctx).output,'_');
    }
    local_8 = SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject>::release
                        ((SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject> *)
                         in_stack_ffffffffffffff20);
  }
  local_24 = 1;
  SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject>::~SingleOwnerPtr
            ((SingleOwnerPtr<Clasp::Cli::Output,_Clasp::DeleteObject> *)0x118a16);
  return local_8;
}

Assistant:

Output* ClaspAppBase::createOutput(ProblemType f) {
	SingleOwnerPtr<Output> out;
	if (claspAppOpts_.outf == ClaspAppOptions::out_none) {
		return 0;
	}
	if (claspAppOpts_.outf != ClaspAppOptions::out_json || claspAppOpts_.onlyPre) {
		TextOptions options;
		options.format = TextOutput::format_asp;
		if      (f == Problem_t::Sat){ options.format = TextOutput::format_sat09; }
		else if (f == Problem_t::Pb) { options.format = TextOutput::format_pb09;  }
		else if (f == Problem_t::Asp && claspAppOpts_.outf == ClaspAppOptions::out_comp) {
			options.format = TextOutput::format_aspcomp;
		}
		options.verbosity = verbose();
		options.catAtom = claspAppOpts_.outAtom.c_str();
		options.ifs = claspAppOpts_.ifs;
		out.reset(createTextOutput(options));
		TextOutput* textOut = dynamic_cast<TextOutput*>(out.get());
		if (claspConfig_.parse.isEnabled(ParserOptions::parse_maxsat) && f == Problem_t::Sat && textOut) {
			textOut->result[TextOutput::res_sat] = "UNKNOWN";
		}
	}
	else {
		out.reset(createJsonOutput(verbose()));
	}

	if (out.get()) {
		if (claspAppOpts_.quiet[0] != static_cast<uint8>(UCHAR_MAX)) {
			out->setModelQuiet((Output::PrintLevel)std::min(uint8(Output::print_no), claspAppOpts_.quiet[0]));
		}
		if (claspAppOpts_.quiet[1] != static_cast<uint8>(UCHAR_MAX)) {
			out->setOptQuiet((Output::PrintLevel)std::min(uint8(Output::print_no), claspAppOpts_.quiet[1]));
		}
		if (claspAppOpts_.quiet[2] != static_cast<uint8>(UCHAR_MAX)) {
			out->setCallQuiet((Output::PrintLevel)std::min(uint8(Output::print_no), claspAppOpts_.quiet[2]));
		}
	}
	if (claspAppOpts_.hideAux && clasp_.get()) {
		clasp_->ctx.output.setFilter('_');
	}
	return out.release();
}